

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void google::protobuf::internal::MapMergeFrom<long,proto2_unittest::Proto2MapEnum>
               (Map<long,_proto2_unittest::Proto2MapEnum> *dest,
               Map<long,_proto2_unittest::Proto2MapEnum> *src)

{
  Proto2MapEnum PVar1;
  bool bVar2;
  reference key;
  Proto2MapEnum *pPVar3;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  Map<long,_proto2_unittest::Proto2MapEnum> *__range3;
  Map<long,_proto2_unittest::Proto2MapEnum> *src_local;
  Map<long,_proto2_unittest::Proto2MapEnum> *dest_local;
  
  Map<long,_proto2_unittest::Proto2MapEnum>::begin
            ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,src);
  Map<long,_proto2_unittest::Proto2MapEnum>::end((const_iterator *)&elem,src);
  while( true ) {
    bVar2 = protobuf::operator!=
                      ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&elem);
    if (!bVar2) break;
    key = Map<long,_proto2_unittest::Proto2MapEnum>::const_iterator::operator*
                    ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
    PVar1 = key->second;
    pPVar3 = Map<long,_proto2_unittest::Proto2MapEnum>::operator[]<long>(dest,&key->first);
    *pPVar3 = PVar1;
    Map<long,_proto2_unittest::Proto2MapEnum>::const_iterator::operator++
              ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}